

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::MultipleDriverVisitor::check_var(Var *var)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  int iVar2;
  VarType VVar3;
  uint uVar4;
  IRNodeKind IVar5;
  StatementType SVar6;
  StatementBlockType SVar7;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *this;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar8;
  element_type *peVar9;
  Var **ppVVar10;
  undefined4 extraout_var;
  element_type *peVar11;
  undefined4 extraout_var_00;
  StmtException *this_01;
  undefined4 extraout_var_01;
  remove_reference_t<std::__cxx11::basic_string<char>_> *prVar12;
  char (*format_str) [42];
  Stmt *stmt_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<kratos::IRNode_*,_kratos::Stmt_*> pVar13;
  string_view format_str_00;
  format_args args;
  StmtBlock *local_2a8;
  StmtBlock *local_298;
  Stmt *local_228;
  IRNode *local_220;
  pair<kratos::IRNode_*,_kratos::Stmt_*> local_218;
  undefined1 local_202;
  allocator<kratos::IRNode_*> local_201;
  IRNode *local_200;
  Stmt *local_1f8;
  element_type *local_1f0;
  iterator local_1e8;
  size_type local_1e0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_1d8;
  v7 local_1c0 [32];
  string local_1a0;
  StmtBlock *local_180;
  StmtBlock *block_1;
  Stmt *st_1;
  StmtBlock *block;
  Stmt *st;
  remove_reference_t<std::__cxx11::basic_string<char>_> *prStack_158;
  bool has_multiple_driver;
  type *ref_stmt_parent;
  type *ref_parent;
  StmtBlock *local_140;
  Stmt *stmt_parent;
  IRNode *parent;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_false>
  local_128;
  uint local_120;
  uint local_11c;
  uint32_t i;
  uint32_t var_high;
  uint32_t var_low;
  shared_ptr<kratos::VarSlice> slice;
  Var *v;
  value_type *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
  parents;
  Var *var_local;
  undefined8 local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  parents._M_h._M_single_bucket = (__node_base_ptr)var;
  std::
  unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
                   *)&__range2);
  this = (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          *)(*(code *)(parents._M_h._M_single_bucket)->_M_nxt[0x10]._M_nxt)();
  __end2 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin(this);
  stmt = (value_type *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::end(this);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                       ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt);
    if (!bVar1) {
      std::
      unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
                        *)&__range2);
      return;
    }
    this_00 = &std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
               ::operator*(&__end2)->
               super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
    peVar8 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    bVar1 = has_for_loop(&peVar8->super_Stmt);
    if (!bVar1) {
      peVar9 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
      ppVVar10 = AssignStmt::left(peVar9);
      slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppVVar10;
      iVar2 = (*(((Var *)slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_IRNode)._vptr_IRNode[0x29])();
      if ((__node_base_ptr)CONCAT44(extraout_var,iVar2) == parents._M_h._M_single_bucket) {
        VVar3 = Var::type((Var *)slice.
                                 super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
        if (VVar3 == Slice) {
          Var::as<kratos::VarSlice>((Var *)&var_low);
          peVar11 = std::
                    __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&var_low);
          uVar4 = (*(peVar11->super_Var).super_IRNode._vptr_IRNode[0x2b])();
          if ((uVar4 & 1) == 0) {
            var_high = 0;
          }
          else {
            var_high = 3;
          }
          std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)&var_low);
          if (var_high != 0) goto LAB_003e27d5;
        }
        i = (*(slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base[0x26])();
        local_11c = (*(slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base[0x25])();
        for (local_120 = i; local_120 <= local_11c; local_120 = local_120 + 1) {
          local_128._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
               ::find((unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
                       *)&__range2,&local_120);
          parent = (IRNode *)
                   std::
                   unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
                   ::end((unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
                          *)&__range2);
          stmt_00 = (Stmt *)&parent;
          bVar1 = std::__detail::operator!=
                            (&local_128,
                             (_Node_iterator_base<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_false>
                              *)stmt_00);
          if (bVar1) {
            peVar9 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this_00);
            iVar2 = (*(peVar9->super_Stmt).super_IRNode._vptr_IRNode[4])();
            stmt_parent = (Stmt *)CONCAT44(extraout_var_00,iVar2);
            peVar8 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get(this_00)
            ;
            local_140 = (StmtBlock *)non_gen_root_parent((MultipleDriverVisitor *)peVar8,stmt_00);
            ref_parent = &std::
                          unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
                          ::at((unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
                                *)&__range2,&local_120)->first;
            ref_stmt_parent =
                 (type *)std::get<0ul,kratos::IRNode*,kratos::Stmt*>
                                   ((pair<kratos::IRNode_*,_kratos::Stmt_*> *)ref_parent);
            prStack_158 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
                          std::get<1ul,kratos::IRNode*,kratos::Stmt*>
                                    ((pair<kratos::IRNode_*,_kratos::Stmt_*> *)ref_parent);
            st._7_1_ = local_140 != *(StmtBlock **)prStack_158;
            prVar12 = prStack_158;
            if (!(bool)st._7_1_) {
              prVar12 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)ref_stmt_parent;
              if (stmt_parent == *ref_stmt_parent) {
                st._7_1_ = 1;
                IVar5 = IRNode::ir_node_kind((IRNode *)local_140);
                if ((IVar5 == StmtKind) && (block = local_140, local_140 != (StmtBlock *)0x0)) {
                  SVar6 = Stmt::type(&local_140->super_Stmt);
                  if (SVar6 == Block) {
                    if (block == (StmtBlock *)0x0) {
                      local_298 = (StmtBlock *)0x0;
                    }
                    else {
                      prVar12 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)0x0;
                      local_298 = (StmtBlock *)
                                  __dynamic_cast(block,&Stmt::typeinfo,&StmtBlock::typeinfo);
                    }
                    st_1 = &local_298->super_Stmt;
                    SVar7 = StmtBlock::block_type(local_298);
                    if (SVar7 != Combinational) {
                      SVar7 = StmtBlock::block_type((StmtBlock *)st_1);
                      if (SVar7 != Latch) goto LAB_003e245e;
                    }
                    st._7_1_ = 0;
                  }
                }
              }
              else {
                IVar5 = IRNode::ir_node_kind((IRNode *)local_140);
                if ((IVar5 == StmtKind) && (block_1 = local_140, local_140 != (StmtBlock *)0x0)) {
                  SVar6 = Stmt::type(&local_140->super_Stmt);
                  if (SVar6 == Block) {
                    if (block_1 == (StmtBlock *)0x0) {
                      local_2a8 = (StmtBlock *)0x0;
                    }
                    else {
                      prVar12 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)0x0;
                      local_2a8 = (StmtBlock *)
                                  __dynamic_cast(block_1,&Stmt::typeinfo,&StmtBlock::typeinfo);
                    }
                    local_180 = local_2a8;
                    SVar7 = StmtBlock::block_type(local_2a8);
                    if (SVar7 == Sequential) {
                      bVar1 = share_root(&stmt_parent->super_IRNode,
                                         &(*ref_stmt_parent)->super_IRNode);
                      st._7_1_ = (bVar1 ^ 0xffU) & 1;
                    }
                  }
                }
              }
            }
LAB_003e245e:
            if ((st._7_1_ & 1) != 0) {
              local_202 = 1;
              this_01 = (StmtException *)__cxa_allocate_exception(0x10);
              (*(code *)(parents._M_h._M_single_bucket)->_M_nxt[0x20]._M_nxt)(local_1c0);
              local_38 = &local_1a0;
              local_40 = "{0} has multiple driver in the same scope";
              vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1c0;
              local_68.named_args.data =
                   (named_arg_info<char> *)
                   fmt::v7::make_args_checked<std::__cxx11::string,char[42],char>
                             ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)"{0} has multiple driver in the same scope",(v7 *)vargs,format_str,
                              prVar12);
              local_50 = &local_68;
              local_78 = fmt::v7::to_string_view<char,_0>(local_40);
              local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                          *)&var_local;
              local_30 = local_50;
              local_20 = local_50;
              local_10 = local_50;
              local_18 = local_28;
              fmt::v7::
              basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              ::basic_format_args(local_28,0xd,
                                  (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                   *)&local_50->string);
              format_str_00.size_ = (size_t)var_local;
              format_str_00.data_ = (char *)local_78.size_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.values_ = in_R9.values_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = local_80;
              fmt::v7::detail::vformat_abi_cxx11_
                        (&local_1a0,(detail *)local_78.data_,format_str_00,args);
              local_200 = (IRNode *)parents._M_h._M_single_bucket;
              local_1f8 = stmt_parent;
              local_1f0 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                    (this_00);
              local_1e8 = &local_200;
              local_1e0 = 3;
              std::allocator<kratos::IRNode_*>::allocator(&local_201);
              __l._M_len = local_1e0;
              __l._M_array = local_1e8;
              std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                        (&local_1d8,__l,&local_201);
              StmtException::StmtException(this_01,&local_1a0,&local_1d8);
              local_202 = 0;
              __cxa_throw(this_01,&StmtException::typeinfo,StmtException::~StmtException);
            }
          }
          else {
            peVar9 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this_00);
            iVar2 = (*(peVar9->super_Stmt).super_IRNode._vptr_IRNode[4])();
            local_220 = (IRNode *)CONCAT44(extraout_var_01,iVar2);
            peVar8 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get(this_00)
            ;
            local_228 = non_gen_root_parent((MultipleDriverVisitor *)peVar8,stmt_00);
            pVar13 = std::make_pair<kratos::IRNode*,kratos::Stmt*>(&local_220,&local_228);
            local_218 = pVar13;
            std::
            unordered_map<unsigned_int,std::pair<kratos::IRNode*,kratos::Stmt*>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>>>
            ::emplace<unsigned_int&,std::pair<kratos::IRNode*,kratos::Stmt*>>
                      ((unordered_map<unsigned_int,std::pair<kratos::IRNode*,kratos::Stmt*>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>>>
                        *)&__range2,&local_120,&local_218);
          }
        }
      }
    }
LAB_003e27d5:
    std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
    operator++(&__end2);
  } while( true );
}

Assistant:

static void check_var(Var* var) {
        std::unordered_map<uint32_t, std::pair<IRNode*, Stmt*>> parents;
        for (auto const& stmt : var->sources()) {
            // TODO: FIX THIS
            //  This is a hack to bypass the check if there is a for loop
            if (has_for_loop(stmt.get())) continue;
            auto* v = stmt->left();
            if (v->get_var_root_parent() != var) continue;
            if (v->type() == VarType::Slice) {
                auto slice = v->as<VarSlice>();
                if (slice->sliced_by_var()) continue;
            }
            uint32_t var_low = v->var_low();
            uint32_t var_high = v->var_high();
            for (uint32_t i = var_low; i <= var_high; i++) {
                if (parents.find(i) != parents.end()) {
                    auto* parent = stmt->parent();
                    auto* stmt_parent = non_gen_root_parent(stmt.get());
                    auto const& [ref_parent, ref_stmt_parent] = parents.at(i);
                    // the purpose of the following statement is to make sure that there is no
                    // other assignment that's assigning the same var slice in the same scope
                    // it cannot be driven through different blocks, either.
                    // notice that there is a caveat. in combinational block, as long as the
                    // they are in the same stmt parent, they can have different scope, since
                    // having different scope implies priority. as a result, we need to filter
                    // this case out
                    bool has_multiple_driver = stmt_parent != ref_stmt_parent;
                    if (!has_multiple_driver) {
                        // skip the special case
                        if (parent == ref_parent) {
                            has_multiple_driver = true;
                            if (stmt_parent->ir_node_kind() == IRNodeKind::StmtKind) {
                                auto* st = dynamic_cast<Stmt*>(stmt_parent);
                                if (st && st->type() == StatementType::Block) {
                                    auto* block = dynamic_cast<StmtBlock*>(st);
                                    if (block->block_type() == StatementBlockType::Combinational ||
                                        block->block_type() == StatementBlockType::Latch) {
                                        has_multiple_driver = false;
                                    }
                                }
                            }
                        } else {
                            if (stmt_parent->ir_node_kind() == IRNodeKind::StmtKind) {
                                auto* st = dynamic_cast<Stmt*>(stmt_parent);
                                if (st && st->type() == StatementType::Block) {
                                    auto* block = dynamic_cast<StmtBlock*>(st);
                                    if (block->block_type() == StatementBlockType::Sequential) {
                                        // TODO: this algorithm is not perfect as it only
                                        //  accounts for standalone assignments
                                        has_multiple_driver = !share_root(parent, ref_parent);
                                    }
                                }
                            }
                        }
                    }
                    if (has_multiple_driver) {
                        throw StmtException(::format("{0} has multiple driver in the same scope",
                                                     var->handle_name()),
                                            {var, parent, stmt.get()});
                    }
                } else {
                    parents.emplace(
                        i, std::make_pair(stmt->parent(), non_gen_root_parent(stmt.get())));
                }
            }
        }
    }